

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

size_t input_to_detect_buf(AvxInputContext *input_ctx,size_t n)

{
  ulong uVar1;
  size_t in_RSI;
  long in_RDI;
  size_t read_n;
  size_t buffered_bytes;
  size_t local_20;
  
  if (in_RSI + *(long *)(in_RDI + 0x48) < 0x23) {
    uVar1 = *(long *)(in_RDI + 0x40) - *(long *)(in_RDI + 0x48);
    if (uVar1 == 0) {
      local_20 = fread((void *)(in_RDI + 0x18 + *(long *)(in_RDI + 0x40)),1,in_RSI,
                       *(FILE **)(in_RDI + 8));
      *(size_t *)(in_RDI + 0x40) = local_20 + *(long *)(in_RDI + 0x40);
    }
    else {
      local_20 = in_RSI;
      if (uVar1 < in_RSI) {
        local_20 = fread((void *)(in_RDI + 0x18 + *(long *)(in_RDI + 0x40)),1,in_RSI - uVar1,
                         *(FILE **)(in_RDI + 8));
        *(size_t *)(in_RDI + 0x40) = local_20 + *(long *)(in_RDI + 0x40);
        local_20 = uVar1 + local_20;
      }
    }
    return local_20;
  }
  die("Failed to store in the detect buffer, maximum size exceeded.");
}

Assistant:

size_t input_to_detect_buf(struct AvxInputContext *input_ctx, size_t n) {
  if (n + input_ctx->detect.position > DETECT_BUF_SZ) {
    die("Failed to store in the detect buffer, maximum size exceeded.");
  }
  const size_t buffered_bytes =
      input_ctx->detect.buf_read - input_ctx->detect.position;
  size_t read_n;
  if (buffered_bytes == 0) {
    read_n = fread(input_ctx->detect.buf + input_ctx->detect.buf_read, 1, n,
                   input_ctx->file);
    input_ctx->detect.buf_read += read_n;
  } else if (n <= buffered_bytes) {
    // In this case, don't need to do anything as the data is already in
    // the detect buffer
    read_n = n;
  } else {
    read_n = fread(input_ctx->detect.buf + input_ctx->detect.buf_read, 1,
                   n - buffered_bytes, input_ctx->file);
    input_ctx->detect.buf_read += read_n;
    read_n += buffered_bytes;
  }
  return read_n;
}